

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

uint64_t PopulationCost(uint32_t *population,int length,uint16_t *trivial_sym,uint8_t *is_used)

{
  uint16_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LBitEntropy local_40;
  VP8LStreaks local_28;
  
  (*VP8LGetEntropyUnrefined)(population,length,&local_40,&local_28);
  if (trivial_sym != (uint16_t *)0x0) {
    uVar1 = 0xffff;
    if (local_40.nonzeros == 1) {
      uVar1 = (uint16_t)local_40.nonzero_code;
    }
    *trivial_sym = uVar1;
  }
  if (is_used != (uint8_t *)0x0) {
    *is_used = local_28.streaks[1][1] != 0 || local_28.streaks[1][0] != 0;
  }
  uVar2 = BitsEntropyRefine(&local_40);
  uVar3 = FinalHuffmanCost(&local_28);
  return uVar3 + uVar2;
}

Assistant:

static uint64_t PopulationCost(const uint32_t* const population, int length,
                               uint16_t* const trivial_sym,
                               uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  if (is_used != NULL) {
    // The histogram is used if there is at least one non-zero streak.
    *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);
  }

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}